

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

char * get_netscape_format(Cookie *co)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar2 = co->domain;
  pcVar7 = "FALSE";
  if (co->tailmatch == true) {
    if (pcVar2 != (char *)0x0) {
      pcVar1 = "@cd .";
      if (*pcVar2 == '.') {
        pcVar1 = "PK\x01\x02";
      }
      pcVar6 = "TRUE";
      goto LAB_003c6062;
    }
    pcVar2 = (char *)0x0;
    pcVar6 = "TRUE";
  }
  else {
    pcVar6 = "FALSE";
  }
  pcVar1 = "PK\x01\x02";
LAB_003c6062:
  pcVar3 = "unknown";
  if (pcVar2 != (char *)0x0) {
    pcVar3 = pcVar2;
  }
  pcVar2 = "/";
  if (co->path != (char *)0x0) {
    pcVar2 = co->path;
  }
  pcVar4 = co->value;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "";
  }
  if (co->secure != false) {
    pcVar7 = "TRUE";
  }
  pcVar5 = "#HttpOnly_";
  if (co->httponly == false) {
    pcVar5 = "";
  }
  pcVar2 = curl_maprintf("%s%s%s\t%s\t%s\t%s\t%ld\t%s\t%s",pcVar5,pcVar1 + 4,pcVar3,pcVar6,pcVar2,
                         pcVar7,co->expires,co->name,pcVar4);
  return pcVar2;
}

Assistant:

static char *get_netscape_format(const struct Cookie *co)
{
  return aprintf(
    "%s"     /* httponly preamble */
    "%s%s\t" /* domain */
    "%s\t"   /* tailmatch */
    "%s\t"   /* path */
    "%s\t"   /* secure */
    "%" CURL_FORMAT_CURL_OFF_T "\t"   /* expires */
    "%s\t"   /* name */
    "%s",    /* value */
    co->httponly?"#HttpOnly_":"",
    /* Make sure all domains are prefixed with a dot if they allow
       tailmatching. This is Mozilla-style. */
    (co->tailmatch && co->domain && co->domain[0] != '.')? ".":"",
    co->domain?co->domain:"unknown",
    co->tailmatch?"TRUE":"FALSE",
    co->path?co->path:"/",
    co->secure?"TRUE":"FALSE",
    co->expires,
    co->name,
    co->value?co->value:"");
}